

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O1

void __thiscall
embree::sse2::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::RecalculatePrimRef<embree::UserGeometry>,_2UL>
::TemporalBinInfo::bin
          (TemporalBinInfo *this,PrimRefMB *prims,size_t begin,size_t end,BBox1f time_range,
          SetMB *set,RecalculatePrimRef<embree::UserGeometry> *recalculatePrimRef)

{
  Geometry *pGVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  TemporalBinInfo *pTVar7;
  int iVar8;
  PrimRefMB *pPVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined8 in_XMM0_Qb;
  undefined1 extraout_var [12];
  undefined4 uVar20;
  undefined1 auVar13 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar26;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  BBox<embree::Vec3fa> blower0;
  undefined8 local_198;
  float fStack_190;
  float fStack_18c;
  undefined8 local_188;
  float fStack_180;
  float fStack_17c;
  float local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  undefined8 local_148;
  float fStack_140;
  float fStack_13c;
  undefined8 local_138;
  float fStack_130;
  float fStack_12c;
  PrimRefMB *local_120;
  undefined8 local_118;
  float fStack_110;
  float fStack_10c;
  undefined8 local_108;
  float fStack_100;
  float fStack_fc;
  undefined8 local_f8;
  float fStack_f0;
  float fStack_ec;
  undefined8 local_e8;
  float fStack_e0;
  float fStack_dc;
  void *local_d0;
  float local_c8;
  int local_c4;
  undefined8 *local_c0;
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  size_t local_a0;
  TemporalBinInfo *local_98;
  RecalculatePrimRef<embree::UserGeometry> *local_90;
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_78 = time_range.upper;
  local_68._8_4_ = (int)in_XMM0_Qb;
  local_68._0_8_ = time_range;
  local_68._12_4_ = (int)((ulong)in_XMM0_Qb >> 0x20);
  auVar17._12_4_ = (set->super_PrimInfoMB).max_time_range.lower;
  fVar25 = (set->super_PrimInfoMB).max_time_range.upper - auVar17._12_4_;
  fVar12 = (float)(set->super_PrimInfoMB).max_num_time_segments;
  local_98 = this;
  local_90 = recalculatePrimRef;
  fStack_74 = local_78;
  fStack_70 = local_78;
  fStack_6c = local_78;
  fVar10 = roundf((((time_range.lower * 0.5 + local_78 * 0.5) - auVar17._12_4_) / fVar25) * fVar12);
  uVar18 = extraout_var._0_4_;
  uVar19 = extraout_var._4_4_;
  uVar20 = extraout_var._8_4_;
  auVar17._12_4_ = (fVar10 / fVar12) * fVar25 + auVar17._12_4_;
  local_a0 = end;
  local_88 = auVar17._12_4_;
  uStack_84 = uVar18;
  uStack_80 = uVar19;
  uStack_7c = uVar20;
  if (begin < end &&
      !(bool)(~((float)local_68._0_4_ < auVar17._12_4_ && auVar17._12_4_ < local_78) & 1)) {
    do {
      pPVar9 = prims + begin;
      if (((float)local_68._0_4_ < prims[begin].time_range.upper * 0.9999) &&
         ((pPVar9->time_range).lower * 1.0001 < auVar17._12_4_)) {
        fVar25 = (pPVar9->lbounds).bounds0.upper.field_0.m128[3];
        pGVar1 = (local_90->scene->geometries).items
                 [(uint)(pPVar9->lbounds).bounds0.lower.field_0.m128[3]].ptr;
        fVar10 = pGVar1->fnumTimeSegments;
        fVar12 = (pGVar1->time_range).lower;
        local_178 = (pGVar1->time_range).upper - fVar12;
        local_b8 = ((float)local_68._0_4_ - fVar12) / local_178;
        local_178 = (auVar17._12_4_ - fVar12) / local_178;
        fVar11 = fVar10 * local_b8;
        auVar24._0_4_ = fVar10 * local_178;
        uStack_174 = uVar18;
        uStack_170 = uVar19;
        uStack_16c = uVar20;
        local_120 = pPVar9;
        auVar17._12_4_ = floorf(fVar11);
        fVar12 = ceilf(auVar24._0_4_);
        iVar8 = (int)auVar17._12_4_;
        if (auVar17._12_4_ <= 0.0) {
          auVar17._12_4_ = 0.0;
        }
        auVar13._12_4_ = fVar12;
        if (fVar10 <= fVar12) {
          auVar13._12_4_ = fVar10;
        }
        fStack_18c = (float)(int)auVar17._12_4_;
        if (iVar8 < 0) {
          iVar8 = -1;
        }
        iVar6 = (int)fVar10 + 1;
        if ((int)fVar12 < (int)fVar10 + 1) {
          iVar6 = (int)fVar12;
        }
        local_198 = pGVar1->userPtr;
        local_188 = &local_58;
        fStack_190 = fVar25;
        local_168 = fStack_18c;
        (**(code **)&pGVar1->field_0x58)(&local_198);
        local_f8 = pGVar1->userPtr;
        local_158 = (float)(int)auVar13._12_4_;
        fStack_f0 = fVar25;
        fStack_ec = (float)(int)auVar13._12_4_;
        local_e8 = &local_198;
        (**(code **)&pGVar1->field_0x58)(&local_f8);
        fVar11 = fVar11 - auVar17._12_4_;
        if (iVar6 - iVar8 == 1) {
          if (fVar11 <= 0.0) {
            fVar11 = 0.0;
          }
          auVar17._12_4_ = 1.0 - fVar11;
          fVar31 = auVar17._12_4_ * local_58 + fVar11 * (float)local_198;
          fVar32 = auVar17._12_4_ * fStack_54 + fVar11 * local_198._4_4_;
          fVar33 = auVar17._12_4_ * fStack_50 + fVar11 * fStack_190;
          fVar34 = auVar17._12_4_ * fStack_4c + fVar11 * fStack_18c;
          fVar12 = auVar17._12_4_ * local_48 + fVar11 * (float)local_188;
          fVar29 = auVar17._12_4_ * fStack_44 + fVar11 * local_188._4_4_;
          fVar30 = auVar17._12_4_ * fStack_40 + fVar11 * fStack_180;
          fVar11 = auVar17._12_4_ * fStack_3c + fVar11 * fStack_17c;
          auVar13._12_4_ = auVar13._12_4_ - auVar24._0_4_;
          if (auVar13._12_4_ <= 0.0) {
            auVar13._12_4_ = 0.0;
          }
          auVar17._12_4_ = 1.0 - auVar13._12_4_;
          auVar24._0_4_ = (float)local_198 * auVar17._12_4_ + local_58 * auVar13._12_4_;
          auVar24._4_4_ = local_198._4_4_ * auVar17._12_4_ + fStack_54 * auVar13._12_4_;
          auVar24._8_4_ = fStack_190 * auVar17._12_4_ + fStack_50 * auVar13._12_4_;
          auVar24._12_4_ = fStack_18c * auVar17._12_4_ + fStack_4c * auVar13._12_4_;
          auVar17._0_4_ = auVar17._12_4_ * (float)local_188 + auVar13._12_4_ * local_48;
          auVar17._4_4_ = auVar17._12_4_ * local_188._4_4_ + auVar13._12_4_ * fStack_44;
          auVar17._8_4_ = auVar17._12_4_ * fStack_180 + auVar13._12_4_ * fStack_40;
          auVar17._12_4_ = auVar17._12_4_ * fStack_17c + auVar13._12_4_ * fStack_3c;
        }
        else {
          fStack_10c = (float)((int)local_168 + 1);
          local_118 = pGVar1->userPtr;
          fStack_110 = fVar25;
          local_108 = &local_f8;
          (**(code **)&pGVar1->field_0x58)(&local_118);
          fStack_13c = (float)((int)local_158 + -1);
          local_148 = pGVar1->userPtr;
          fStack_140 = fVar25;
          local_138 = &local_118;
          (**(code **)&pGVar1->field_0x58)(&local_148);
          if (fVar11 <= 0.0) {
            fVar11 = 0.0;
          }
          auVar17._12_4_ = 1.0 - fVar11;
          fVar31 = local_58 * auVar17._12_4_ + (float)local_f8 * fVar11;
          fVar32 = fStack_54 * auVar17._12_4_ + local_f8._4_4_ * fVar11;
          fVar33 = fStack_50 * auVar17._12_4_ + fStack_f0 * fVar11;
          fVar34 = fStack_4c * auVar17._12_4_ + fStack_ec * fVar11;
          fVar12 = auVar17._12_4_ * local_48 + fVar11 * (float)local_e8;
          fVar29 = auVar17._12_4_ * fStack_44 + fVar11 * local_e8._4_4_;
          fVar30 = auVar17._12_4_ * fStack_40 + fVar11 * fStack_e0;
          fVar11 = auVar17._12_4_ * fStack_3c + fVar11 * fStack_dc;
          auVar17._12_4_ = auVar13._12_4_ - auVar24._0_4_;
          if (auVar13._12_4_ - auVar24._0_4_ <= 0.0) {
            auVar17._12_4_ = 0.0;
          }
          auVar13._12_4_ = 1.0 - auVar17._12_4_;
          auVar24._0_4_ = (float)local_198 * auVar13._12_4_ + (float)local_118 * auVar17._12_4_;
          auVar24._4_4_ = local_198._4_4_ * auVar13._12_4_ + local_118._4_4_ * auVar17._12_4_;
          auVar24._8_4_ = fStack_190 * auVar13._12_4_ + fStack_110 * auVar17._12_4_;
          auVar24._12_4_ = fStack_18c * auVar13._12_4_ + fStack_10c * auVar17._12_4_;
          auVar17._0_4_ = auVar13._12_4_ * (float)local_188 + auVar17._12_4_ * (float)local_108;
          auVar17._4_4_ = auVar13._12_4_ * local_188._4_4_ + auVar17._12_4_ * local_108._4_4_;
          auVar17._8_4_ = auVar13._12_4_ * fStack_180 + auVar17._12_4_ * fStack_100;
          auVar17._12_4_ = auVar13._12_4_ * fStack_17c + auVar17._12_4_ * fStack_fc;
          iVar8 = iVar8 + 1;
          if (iVar8 < iVar6) {
            local_178 = local_178 - local_b8;
            do {
              auVar13._12_4_ = ((float)iVar8 / fVar10 - local_b8) / local_178;
              auVar15._0_4_ = 1.0 - auVar13._12_4_;
              local_158 = auVar15._0_4_ * fVar12 + auVar13._12_4_ * auVar17._0_4_;
              fStack_154 = auVar15._0_4_ * fVar29 + auVar13._12_4_ * auVar17._4_4_;
              fStack_150 = auVar15._0_4_ * fVar30 + auVar13._12_4_ * auVar17._8_4_;
              fStack_14c = auVar15._0_4_ * fVar11 + auVar13._12_4_ * auVar17._12_4_;
              local_d0 = pGVar1->userPtr;
              local_c0 = &local_148;
              local_168 = auVar24._0_4_;
              fStack_164 = auVar24._4_4_;
              fStack_160 = auVar24._8_4_;
              fStack_15c = auVar24._12_4_;
              local_c8 = fVar25;
              local_c4 = iVar8;
              (**(code **)&pGVar1->field_0x58)(&local_d0);
              auVar22._0_4_ =
                   (float)local_148 - (fVar31 * auVar15._0_4_ + auVar24._0_4_ * auVar13._12_4_);
              auVar22._4_4_ =
                   local_148._4_4_ - (fVar32 * auVar15._0_4_ + auVar24._4_4_ * auVar13._12_4_);
              auVar22._8_4_ = fStack_140 - (fVar33 * auVar15._0_4_ + auVar24._8_4_ * auVar13._12_4_)
              ;
              auVar22._12_4_ =
                   fStack_13c - (fVar34 * auVar15._0_4_ + auVar24._12_4_ * auVar13._12_4_);
              auVar21._0_4_ = (float)local_138 - local_158;
              auVar21._4_4_ = local_138._4_4_ - fStack_154;
              auVar21._8_4_ = fStack_130 - fStack_150;
              auVar21._12_4_ = fStack_12c - fStack_14c;
              auVar13 = minps(auVar22,ZEXT816(0));
              auVar22 = maxps(auVar21,ZEXT816(0));
              fVar31 = fVar31 + auVar13._0_4_;
              fVar32 = fVar32 + auVar13._4_4_;
              fVar33 = fVar33 + auVar13._8_4_;
              fVar34 = fVar34 + auVar13._12_4_;
              auVar24._0_4_ = auVar13._0_4_ + local_168;
              auVar24._4_4_ = auVar13._4_4_ + fStack_164;
              auVar24._8_4_ = auVar13._8_4_ + fStack_160;
              auVar24._12_4_ = auVar13._12_4_ + fStack_15c;
              fVar12 = fVar12 + auVar22._0_4_;
              fVar29 = fVar29 + auVar22._4_4_;
              fVar30 = fVar30 + auVar22._8_4_;
              fVar11 = fVar11 + auVar22._12_4_;
              auVar17._0_4_ = auVar22._0_4_ + auVar17._0_4_;
              auVar17._4_4_ = auVar22._4_4_ + auVar17._4_4_;
              auVar17._8_4_ = auVar22._8_4_ + auVar17._8_4_;
              auVar17._12_4_ = auVar22._12_4_ + auVar17._12_4_;
              iVar8 = iVar8 + 1;
            } while (iVar6 != iVar8);
          }
          else {
          }
        }
        pTVar7 = local_98;
        pPVar9 = local_120;
        auVar4._4_4_ = fVar32;
        auVar4._0_4_ = fVar31;
        auVar4._8_4_ = fVar33;
        auVar4._12_4_ = fVar34;
        aVar26.m128 = (__m128)minps(local_98->bounds0[0].bounds0.lower.field_0,auVar4);
        auVar2._4_4_ = fVar29;
        auVar2._0_4_ = fVar12;
        auVar2._8_4_ = fVar30;
        auVar2._12_4_ = fVar11;
        aVar27.m128 = (__m128)maxps(local_98->bounds0[0].bounds0.upper.field_0,auVar2);
        aVar28.m128 = (__m128)minps(local_98->bounds0[0].bounds1.lower.field_0,auVar24);
        aVar14.m128 = (__m128)maxps(local_98->bounds0[0].bounds1.upper.field_0,auVar17);
        local_98->bounds0[0].bounds0.lower.field_0 = aVar26;
        local_98->bounds0[0].bounds0.upper.field_0 = aVar27;
        local_98->bounds0[0].bounds1.lower.field_0 = aVar28;
        local_98->bounds0[0].bounds1.upper.field_0 = aVar14;
        fVar25 = (float)(uint)(local_120->lbounds).bounds1.upper.field_0.m128[3];
        auVar17._12_4_ = (local_120->time_range).lower;
        fVar12 = (local_120->time_range).upper - auVar17._12_4_;
        fVar11 = local_88 - auVar17._12_4_;
        fVar10 = floorf((((float)local_68._0_4_ - auVar17._12_4_) / fVar12) * 1.0000002 * fVar25);
        auVar17._12_4_ = 0.0;
        if (0.0 <= fVar10) {
          auVar17._12_4_ = fVar10;
        }
        fVar10 = ceilf((fVar11 / fVar12) * 0.99999976 * fVar25);
        if (fVar25 <= fVar10) {
          fVar10 = fVar25;
        }
        pTVar7->count0[0] = pTVar7->count0[0] + (long)((int)fVar10 - (int)auVar17._12_4_);
        end = local_a0;
        auVar17._12_4_ = local_88;
        uVar18 = uStack_84;
        uVar19 = uStack_80;
        uVar20 = uStack_7c;
      }
      if ((auVar17._12_4_ < (pPVar9->time_range).upper * 0.9999) &&
         ((pPVar9->time_range).lower * 1.0001 < local_78)) {
        fVar25 = (pPVar9->lbounds).bounds0.upper.field_0.m128[3];
        pGVar1 = (local_90->scene->geometries).items
                 [(uint)(pPVar9->lbounds).bounds0.lower.field_0.m128[3]].ptr;
        fVar10 = pGVar1->fnumTimeSegments;
        fVar12 = (pGVar1->time_range).lower;
        local_178 = (pGVar1->time_range).upper - fVar12;
        local_b8 = (auVar17._12_4_ - fVar12) / local_178;
        local_178 = (local_78 - fVar12) / local_178;
        fVar11 = fVar10 * local_b8;
        auVar24._0_4_ = fVar10 * local_178;
        local_120 = pPVar9;
        uStack_b4 = uVar18;
        uStack_b0 = uVar19;
        uStack_ac = uVar20;
        auVar17._12_4_ = floorf(fVar11);
        fVar12 = ceilf(auVar24._0_4_);
        iVar8 = (int)auVar17._12_4_;
        if (auVar17._12_4_ <= 0.0) {
          auVar17._12_4_ = 0.0;
        }
        auVar13._12_4_ = fVar12;
        if (fVar10 <= fVar12) {
          auVar13._12_4_ = fVar10;
        }
        fStack_18c = (float)(int)auVar17._12_4_;
        if (iVar8 < 0) {
          iVar8 = -1;
        }
        iVar6 = (int)fVar10 + 1;
        if ((int)fVar12 < (int)fVar10 + 1) {
          iVar6 = (int)fVar12;
        }
        local_198 = pGVar1->userPtr;
        local_188 = &local_58;
        fStack_190 = fVar25;
        local_168 = fStack_18c;
        (**(code **)&pGVar1->field_0x58)(&local_198);
        local_f8 = pGVar1->userPtr;
        local_158 = (float)(int)auVar13._12_4_;
        fStack_f0 = fVar25;
        fStack_ec = (float)(int)auVar13._12_4_;
        local_e8 = &local_198;
        (**(code **)&pGVar1->field_0x58)(&local_f8);
        fVar11 = fVar11 - auVar17._12_4_;
        if (iVar6 - iVar8 == 1) {
          if (fVar11 <= 0.0) {
            fVar11 = 0.0;
          }
          auVar17._12_4_ = 1.0 - fVar11;
          fVar31 = auVar17._12_4_ * local_58 + fVar11 * (float)local_198;
          fVar32 = auVar17._12_4_ * fStack_54 + fVar11 * local_198._4_4_;
          fVar33 = auVar17._12_4_ * fStack_50 + fVar11 * fStack_190;
          fVar34 = auVar17._12_4_ * fStack_4c + fVar11 * fStack_18c;
          fVar12 = auVar17._12_4_ * local_48 + fVar11 * (float)local_188;
          fVar29 = auVar17._12_4_ * fStack_44 + fVar11 * local_188._4_4_;
          fVar30 = auVar17._12_4_ * fStack_40 + fVar11 * fStack_180;
          fVar11 = auVar17._12_4_ * fStack_3c + fVar11 * fStack_17c;
          auVar13._12_4_ = auVar13._12_4_ - auVar24._0_4_;
          if (auVar13._12_4_ <= 0.0) {
            auVar13._12_4_ = 0.0;
          }
          auVar17._12_4_ = 1.0 - auVar13._12_4_;
          auVar15._0_4_ = (float)local_198 * auVar17._12_4_ + local_58 * auVar13._12_4_;
          auVar15._4_4_ = local_198._4_4_ * auVar17._12_4_ + fStack_54 * auVar13._12_4_;
          auVar15._8_4_ = fStack_190 * auVar17._12_4_ + fStack_50 * auVar13._12_4_;
          auVar15._12_4_ = fStack_18c * auVar17._12_4_ + fStack_4c * auVar13._12_4_;
          auVar13._0_4_ = auVar17._12_4_ * (float)local_188 + auVar13._12_4_ * local_48;
          auVar13._4_4_ = auVar17._12_4_ * local_188._4_4_ + auVar13._12_4_ * fStack_44;
          auVar13._8_4_ = auVar17._12_4_ * fStack_180 + auVar13._12_4_ * fStack_40;
          auVar13._12_4_ = auVar17._12_4_ * fStack_17c + auVar13._12_4_ * fStack_3c;
        }
        else {
          fStack_10c = (float)((int)local_168 + 1);
          local_118 = pGVar1->userPtr;
          fStack_110 = fVar25;
          local_108 = &local_f8;
          (**(code **)&pGVar1->field_0x58)(&local_118);
          fStack_13c = (float)((int)local_158 + -1);
          local_148 = pGVar1->userPtr;
          fStack_140 = fVar25;
          local_138 = &local_118;
          (**(code **)&pGVar1->field_0x58)(&local_148);
          if (fVar11 <= 0.0) {
            fVar11 = 0.0;
          }
          auVar17._12_4_ = 1.0 - fVar11;
          fVar31 = local_58 * auVar17._12_4_ + (float)local_f8 * fVar11;
          fVar32 = fStack_54 * auVar17._12_4_ + local_f8._4_4_ * fVar11;
          fVar33 = fStack_50 * auVar17._12_4_ + fStack_f0 * fVar11;
          fVar34 = fStack_4c * auVar17._12_4_ + fStack_ec * fVar11;
          fVar12 = auVar17._12_4_ * local_48 + fVar11 * (float)local_e8;
          fVar29 = auVar17._12_4_ * fStack_44 + fVar11 * local_e8._4_4_;
          fVar30 = auVar17._12_4_ * fStack_40 + fVar11 * fStack_e0;
          fVar11 = auVar17._12_4_ * fStack_3c + fVar11 * fStack_dc;
          auVar17._12_4_ = auVar13._12_4_ - auVar24._0_4_;
          if (auVar13._12_4_ - auVar24._0_4_ <= 0.0) {
            auVar17._12_4_ = 0.0;
          }
          auVar24._0_4_ = 1.0 - auVar17._12_4_;
          auVar15._0_4_ = (float)local_198 * auVar24._0_4_ + (float)local_118 * auVar17._12_4_;
          auVar15._4_4_ = local_198._4_4_ * auVar24._0_4_ + local_118._4_4_ * auVar17._12_4_;
          auVar15._8_4_ = fStack_190 * auVar24._0_4_ + fStack_110 * auVar17._12_4_;
          auVar15._12_4_ = fStack_18c * auVar24._0_4_ + fStack_10c * auVar17._12_4_;
          auVar13._0_4_ = auVar24._0_4_ * (float)local_188 + auVar17._12_4_ * (float)local_108;
          auVar13._4_4_ = auVar24._0_4_ * local_188._4_4_ + auVar17._12_4_ * local_108._4_4_;
          auVar13._8_4_ = auVar24._0_4_ * fStack_180 + auVar17._12_4_ * fStack_100;
          auVar13._12_4_ = auVar24._0_4_ * fStack_17c + auVar17._12_4_ * fStack_fc;
          iVar8 = iVar8 + 1;
          if (iVar8 < iVar6) {
            local_178 = local_178 - local_b8;
            do {
              auVar17._12_4_ = ((float)iVar8 / fVar10 - local_b8) / local_178;
              auVar24._0_4_ = 1.0 - auVar17._12_4_;
              local_158 = auVar24._0_4_ * fVar12 + auVar17._12_4_ * auVar13._0_4_;
              fStack_154 = auVar24._0_4_ * fVar29 + auVar17._12_4_ * auVar13._4_4_;
              fStack_150 = auVar24._0_4_ * fVar30 + auVar17._12_4_ * auVar13._8_4_;
              fStack_14c = auVar24._0_4_ * fVar11 + auVar17._12_4_ * auVar13._12_4_;
              local_d0 = pGVar1->userPtr;
              local_c0 = &local_148;
              local_168 = auVar15._0_4_;
              fStack_164 = auVar15._4_4_;
              fStack_160 = auVar15._8_4_;
              fStack_15c = auVar15._12_4_;
              local_c8 = fVar25;
              local_c4 = iVar8;
              (**(code **)&pGVar1->field_0x58)(&local_d0);
              auVar16._0_4_ =
                   (float)local_148 - (fVar31 * auVar24._0_4_ + auVar15._0_4_ * auVar17._12_4_);
              auVar16._4_4_ =
                   local_148._4_4_ - (fVar32 * auVar24._0_4_ + auVar15._4_4_ * auVar17._12_4_);
              auVar16._8_4_ = fStack_140 - (fVar33 * auVar24._0_4_ + auVar15._8_4_ * auVar17._12_4_)
              ;
              auVar16._12_4_ =
                   fStack_13c - (fVar34 * auVar24._0_4_ + auVar15._12_4_ * auVar17._12_4_);
              auVar23._0_4_ = (float)local_138 - local_158;
              auVar23._4_4_ = local_138._4_4_ - fStack_154;
              auVar23._8_4_ = fStack_130 - fStack_150;
              auVar23._12_4_ = fStack_12c - fStack_14c;
              auVar17 = minps(auVar16,ZEXT816(0));
              auVar24 = maxps(auVar23,ZEXT816(0));
              fVar31 = fVar31 + auVar17._0_4_;
              fVar32 = fVar32 + auVar17._4_4_;
              fVar33 = fVar33 + auVar17._8_4_;
              fVar34 = fVar34 + auVar17._12_4_;
              auVar15._0_4_ = auVar17._0_4_ + local_168;
              auVar15._4_4_ = auVar17._4_4_ + fStack_164;
              auVar15._8_4_ = auVar17._8_4_ + fStack_160;
              auVar15._12_4_ = auVar17._12_4_ + fStack_15c;
              fVar12 = fVar12 + auVar24._0_4_;
              fVar29 = fVar29 + auVar24._4_4_;
              fVar30 = fVar30 + auVar24._8_4_;
              fVar11 = fVar11 + auVar24._12_4_;
              auVar13._0_4_ = auVar24._0_4_ + auVar13._0_4_;
              auVar13._4_4_ = auVar24._4_4_ + auVar13._4_4_;
              auVar13._8_4_ = auVar24._8_4_ + auVar13._8_4_;
              auVar13._12_4_ = auVar24._12_4_ + auVar13._12_4_;
              iVar8 = iVar8 + 1;
            } while (iVar6 != iVar8);
          }
          else {
          }
        }
        pTVar7 = local_98;
        auVar5._4_4_ = fVar32;
        auVar5._0_4_ = fVar31;
        auVar5._8_4_ = fVar33;
        auVar5._12_4_ = fVar34;
        aVar26.m128 = (__m128)minps(local_98->bounds1[0].bounds0.lower.field_0,auVar5);
        auVar3._4_4_ = fVar29;
        auVar3._0_4_ = fVar12;
        auVar3._8_4_ = fVar30;
        auVar3._12_4_ = fVar11;
        aVar27.m128 = (__m128)maxps(local_98->bounds1[0].bounds0.upper.field_0,auVar3);
        aVar28.m128 = (__m128)minps(local_98->bounds1[0].bounds1.lower.field_0,auVar15);
        aVar14.m128 = (__m128)maxps(local_98->bounds1[0].bounds1.upper.field_0,auVar13);
        local_98->bounds1[0].bounds0.lower.field_0 = aVar26;
        local_98->bounds1[0].bounds0.upper.field_0 = aVar27;
        local_98->bounds1[0].bounds1.lower.field_0 = aVar28;
        local_98->bounds1[0].bounds1.upper.field_0 = aVar14;
        fVar11 = (float)(uint)(local_120->lbounds).bounds1.upper.field_0.m128[3];
        auVar17._12_4_ = (local_120->time_range).lower;
        fVar12 = (local_120->time_range).upper - auVar17._12_4_;
        fVar25 = local_78 - auVar17._12_4_;
        fVar10 = floorf(((local_88 - auVar17._12_4_) / fVar12) * 1.0000002 * fVar11);
        auVar17._12_4_ = 0.0;
        if (0.0 <= fVar10) {
          auVar17._12_4_ = fVar10;
        }
        fVar10 = ceilf((fVar25 / fVar12) * 0.99999976 * fVar11);
        if (fVar11 <= fVar10) {
          fVar10 = fVar11;
        }
        pTVar7->count1[0] = pTVar7->count1[0] + (long)((int)fVar10 - (int)auVar17._12_4_);
        end = local_a0;
        auVar17._12_4_ = local_88;
        uVar18 = uStack_84;
        uVar19 = uStack_80;
        uVar20 = uStack_7c;
      }
      begin = begin + 1;
    } while (begin != end);
  }
  return;
}

Assistant:

void bin(const PrimRefMB* prims, size_t begin, size_t end, BBox1f time_range, const SetMB& set, const RecalculatePrimRef& recalculatePrimRef)
          {
            for (int b=0; b<BINS-1; b++)
            {
              const float t = float(b+1)/float(BINS);
              const float ct = lerp(time_range.lower,time_range.upper,t);
              const float center_time = set.align_time(ct);
              if (center_time <= time_range.lower) continue;
              if (center_time >= time_range.upper) continue;
              const BBox1f dt0(time_range.lower,center_time);
              const BBox1f dt1(center_time,time_range.upper);
              
              /* find linear bounds for both time segments */
              for (size_t i=begin; i<end; i++) 
              {
                if (prims[i].time_range_overlap(dt0))
                {
                  const LBBox3fa bn0 = recalculatePrimRef.linearBounds(prims[i],dt0);
#if MBLUR_BIN_LBBOX
                  bounds0[b].extend(bn0);
#else
                  bounds0[b].extend(bn0.interpolate(0.5f));
#endif
                  count0[b] += prims[i].timeSegmentRange(dt0).size();
                }

                if (prims[i].time_range_overlap(dt1))
                {
                  const LBBox3fa bn1 = recalculatePrimRef.linearBounds(prims[i],dt1);
#if MBLUR_BIN_LBBOX
                  bounds1[b].extend(bn1);
#else
                  bounds1[b].extend(bn1.interpolate(0.5f));
#endif
                  count1[b] += prims[i].timeSegmentRange(dt1).size();
                }
              }
            }
          }